

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool re2::IsValidUTF8(StringPiece *s,RegexpStatus *status)

{
  int iVar1;
  size_type sVar2;
  undefined8 *in_RDI;
  RegexpStatus *in_stack_00000008;
  Rune r;
  StringPiece t;
  StringPiece local_28 [2];
  
  local_28[0].data_ = (const_pointer)*in_RDI;
  local_28[0].size_ = in_RDI[1];
  do {
    sVar2 = StringPiece::size(local_28);
    if (sVar2 == 0) {
      return true;
    }
    iVar1 = StringPieceToRune((Rune *)t.size_,(StringPiece *)t.data_,in_stack_00000008);
  } while (-1 < iVar1);
  return false;
}

Assistant:

static bool IsValidUTF8(const StringPiece& s, RegexpStatus* status) {
  StringPiece t = s;
  Rune r;
  while (t.size() > 0) {
    if (StringPieceToRune(&r, &t, status) < 0)
      return false;
  }
  return true;
}